

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

Gia_Man_t * Gia_PermuteSpecial(Gia_Man_t *p)

{
  int nSize;
  int *pArray;
  Vec_Int_t *vPiPerm;
  Gia_Man_t *pGVar1;
  int *pOrder;
  Vec_Int_t *vPerm;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  pArray = Gia_PermuteSpecialOrder(p);
  nSize = Gia_ManPiNum(p);
  vPiPerm = Vec_IntAllocArray(pArray,nSize);
  pGVar1 = Gia_ManDupPerm(p,vPiPerm);
  Vec_IntFree(vPiPerm);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_PermuteSpecial( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vPerm;
    int * pOrder = Gia_PermuteSpecialOrder( p );
    vPerm = Vec_IntAllocArray( pOrder, Gia_ManPiNum(p) );
    pNew = Gia_ManDupPerm( p, vPerm );
    Vec_IntFree( vPerm );
    return pNew;
}